

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_korax.cpp
# Opt level: O3

int AF_A_KoraxChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  AActor *pAVar8;
  AActor *pAVar9;
  AActor **ppAVar10;
  AActor *this;
  VMValue *pVVar11;
  char *__assertion;
  bool bVar12;
  bool bVar13;
  FSoundID local_7c;
  DAngle local_78;
  DAngle local_70;
  DVector3 local_68;
  DVector3 local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e4c9b;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005e4c8b;
  this = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_005e4938;
    pPVar7 = (this->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar4);
      (this->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar12 = pPVar7 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar12;
    bVar13 = pPVar7 == pPVar3;
    if (!bVar13 && !bVar12) {
      do {
        pPVar7 = pPVar7->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
        if (pPVar7 == pPVar3) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    pVVar11 = (VMValue *)(ulong)(bVar13 || bVar12);
    uVar6 = (uint)bVar12;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005e4c9b;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_005e4c8b;
LAB_005e4938:
    this = (AActor *)0x0;
    pVVar11 = param;
    uVar6 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005e4c8b:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005e4c9b;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar7 = (PClass *)puVar2[1];
          if (pPVar7 == (PClass *)0x0) {
            pPVar7 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar11,uVar6,ret);
            puVar2[1] = pPVar7;
          }
          bVar12 = pPVar7 != (PClass *)0x0;
          if (pPVar7 != pPVar3 && bVar12) {
            do {
              pPVar7 = pPVar7->ParentClass;
              bVar12 = pPVar7 != (PClass *)0x0;
              if (pPVar7 == pPVar3) break;
            } while (pPVar7 != (PClass *)0x0);
          }
          if (!bVar12) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005e4c9b;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005e4c8b;
    }
    if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005e4c9b:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                    ,0x5b,"int AF_A_KoraxChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((this->special2 == 0) &&
     (iVar4 = this->health, iVar5 = AActor::SpawnHealth(this), pAVar9 = AActor::TIDHash[0x78],
     iVar4 <= iVar5 / 2)) {
    do {
      if (pAVar9 == (AActor *)0x0) {
LAB_005e4bbf:
        P_StartScript(this,(line_t *)0x0,0xf9,(char *)0x0,(int *)0x0,0,0);
        this->special2 = 1;
        return 0;
      }
      if (pAVar9->tid == 0xf8) {
        local_48.X = (pAVar9->__Pos).X;
        local_48.Y = (pAVar9->__Pos).Y;
        local_48.Z = -2147483648.0;
        local_70.Degrees = (pAVar9->Angles).Yaw.Degrees;
        P_Teleport(this,&local_48,&local_70,3);
        goto LAB_005e4bbf;
      }
      pAVar9 = pAVar9->inext;
    } while( true );
  }
  pAVar9 = (this->target).field_0.p;
  if (pAVar9 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->target).field_0.p = (AActor *)0x0;
    return 0;
  }
  uVar6 = FRandom::GenRand32(&pr_koraxchase);
  if ((uVar6 & 0xfe) < 0x1e) {
    AActor::SetState(this,this->MissileState,false);
  }
  else {
    uVar6 = FRandom::GenRand32(&pr_koraxchase);
    if ((uVar6 & 0xfe) < 0x1e) {
      local_7c.ID = S_FindSound("KoraxActive");
      S_Sound(this,2,&local_7c,1.0,0.0);
    }
  }
  iVar4 = this->health;
  iVar5 = AActor::SpawnHealth(this);
  if (iVar5 >> 1 <= iVar4) {
    return 0;
  }
  uVar6 = FRandom::GenRand32(&pr_koraxchase);
  if (9 < (uVar6 & 0xfe)) {
    return 0;
  }
  pAVar9 = (this->tracer).field_0.p;
  if (pAVar9 != (AActor *)0x0) {
    if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar8 = (AActor *)0x0;
      do {
        ppAVar10 = &pAVar8->inext;
        if (pAVar8 == (AActor *)0x0) {
          ppAVar10 = AActor::TIDHash + 0x79;
        }
        pAVar8 = *ppAVar10;
        while( true ) {
          if (pAVar8 == (AActor *)0x0) goto LAB_005e4c01;
          if (pAVar8->tid == 0xf9) break;
          pAVar8 = pAVar8->inext;
        }
        if (pAVar9 == (AActor *)0x0) {
LAB_005e4b7e:
          pAVar9 = (AActor *)0x0;
        }
        else if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (this->tracer).field_0.p = (AActor *)0x0;
          goto LAB_005e4b7e;
        }
      } while (pAVar8 != pAVar9);
      goto LAB_005e4c03;
    }
    (this->tracer).field_0.p = (AActor *)0x0;
  }
LAB_005e4c01:
  pAVar8 = (AActor *)0x0;
LAB_005e4c03:
  ppAVar10 = AActor::TIDHash + 0x79;
  if (pAVar8 != (AActor *)0x0) {
    ppAVar10 = &pAVar8->inext;
  }
  pAVar9 = *ppAVar10;
  while( true ) {
    if (pAVar9 == (AActor *)0x0) {
      (this->tracer).field_0.p = (AActor *)0x0;
      return 0;
    }
    if (pAVar9->tid == 0xf9) break;
    pAVar9 = pAVar9->inext;
  }
  (this->tracer).field_0.p = pAVar9;
  local_68.X = (pAVar9->__Pos).X;
  local_68.Y = (pAVar9->__Pos).Y;
  local_68.Z = -2147483648.0;
  local_78.Degrees = (pAVar9->Angles).Yaw.Degrees;
  P_Teleport(this,&local_68,&local_78,3);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KoraxChase)
{
	PARAM_ACTION_PROLOGUE;

	AActor *spot;

	if ((!self->special2) && (self->health <= (self->SpawnHealth()/2)))
	{
		FActorIterator iterator (KORAX_FIRST_TELEPORT_TID);
		spot = iterator.Next ();
		if (spot != NULL)
		{
			P_Teleport (self, spot->PosAtZ(ONFLOORZ), spot->Angles.Yaw, TELF_SOURCEFOG | TELF_DESTFOG);
		}

		P_StartScript (self, NULL, 249, NULL, NULL, 0, 0);
		self->special2 = 1;	// Don't run again

		return 0;
	}

	if (self->target == NULL)
	{
		return 0;
	}
	if (pr_koraxchase()<30)
	{
		self->SetState (self->MissileState);
	}
	else if (pr_koraxchase()<30)
	{
		S_Sound (self, CHAN_VOICE, "KoraxActive", 1, ATTN_NONE);
	}

	// Teleport away
	if (self->health < (self->SpawnHealth()>>1))
	{
		if (pr_koraxchase()<10)
		{
			FActorIterator iterator (KORAX_TELEPORT_TID);

			if (self->tracer != NULL)
			{	// Find the previous teleport destination
				do
				{
					spot = iterator.Next ();
				} while (spot != NULL && spot != self->tracer);
			}

			// Go to the next teleport destination
			spot = iterator.Next ();
			self->tracer = spot;
			if (spot)
			{
				P_Teleport (self, spot->PosAtZ(ONFLOORZ), spot->Angles.Yaw, TELF_SOURCEFOG | TELF_DESTFOG);
			}
		}
	}
	return 0;
}